

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O0

void __thiscall
DelIRCCommand::trigger
          (DelIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  string_view section_00;
  string_view rhs;
  bool bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  undefined8 uVar5;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>
  *this_00;
  Config *pCVar6;
  size_t sVar7;
  char *pcVar8;
  __sv_type _Var9;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  size_t local_240;
  char *local_238;
  size_t local_220;
  char *local_218;
  size_t local_200;
  char *local_1f8;
  size_t local_1d0;
  char *local_1c8;
  size_t local_1b0;
  char *local_1a8;
  size_t local_190;
  char *local_188;
  size_t local_170;
  char *local_168;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  reference local_100;
  value_type *section;
  const_iterator __end7;
  const_iterator __begin7;
  SectionHashTable *__range7;
  char *local_d8;
  uint local_9c;
  uint i;
  bool serverMatch;
  int type;
  PlayerInfo *player;
  Server *server;
  Channel *chan;
  char *local_60;
  string_view parameters_view;
  IRC_Bot *source_local;
  DelIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  rhs = parameters;
  pcVar8 = nick._M_str;
  sVar7 = nick._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
  if (bVar1) {
    bVar10 = sv("Error: Too few parameters. Syntax: del <player>",0x2f);
    chan = (Channel *)bVar10._M_len;
    local_60 = bVar10._M_str;
    Jupiter::IRC::Client::sendNotice(source,sVar7,pcVar8,chan,local_60);
    return;
  }
  lVar3 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
  if (lVar3 == 0) {
    return;
  }
  Jupiter::IRC::Client::Channel::getType();
  bVar1 = false;
  local_9c = 0;
  do {
    RenX::getCore();
    uVar4 = RenX::Core::getServerCount();
    if (local_9c == uVar4) {
LAB_0011dad5:
      if (!bVar1) {
        bVar10 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
        local_240 = bVar10._M_len;
        local_238 = bVar10._M_str;
        Jupiter::IRC::Client::sendMessage(source,channel._M_len,channel._M_str,local_240,local_238);
      }
      return;
    }
    uVar4 = RenX::getCore();
    uVar5 = RenX::Core::getServer(uVar4);
    uVar4 = RenX::Server::isLogChanType((int)uVar5);
    if ((uVar4 & 1) != 0) {
      bVar1 = true;
      lVar3 = RenX::Server::getPlayerByPartName(uVar5,parameters._M_len,parameters._M_str);
      if (lVar3 == 0) {
        section_00._M_str = parameters._M_str;
        section_00._M_len = parameters._M_len;
        bVar2 = RenX_ModSystemPlugin::removeModSection(&pluginInstance,section_00);
        if (bVar2) {
          bVar10 = sv("Player has been removed from the moderator list.",0x30);
          __range7 = (SectionHashTable *)bVar10._M_len;
          local_d8 = bVar10._M_str;
          Jupiter::IRC::Client::sendNotice(source,sVar7,pcVar8,__range7,local_d8);
        }
        else {
          Jupiter::Plugin::getConfig();
          this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>
                     *)Jupiter::Config::getSections_abi_cxx11_();
          __end7 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>
                   ::begin(this_00);
          section = (value_type *)
                    std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>
                    ::end(this_00);
          while( true ) {
            bVar2 = std::__detail::operator==
                              (&__end7.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>
                               ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>
                                 *)&section);
            if (((bVar2 ^ 0xffU) & 1) == 0) break;
            local_100 = std::__detail::
                        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false,_false>
                        ::operator*(&__end7);
            pCVar6 = &local_100->second;
            local_120 = sv("Name",4);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130);
            bVar10 = (basic_string_view<char,_std::char_traits<char>_>)
                     Jupiter::Config::get
                               (pCVar6,local_120._M_len,local_120._M_str,local_130._M_len,
                                local_130._M_str);
            local_110 = bVar10;
            bVar2 = jessilib::equalsi<char,char>(bVar10,rhs);
            if (bVar2) {
              _Var9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_100);
              bVar1 = RenX_ModSystemPlugin::removeModSection(&pluginInstance,_Var9);
              if (!bVar1) {
                bVar10 = sv("Error: Unknown error occurred.",0x1e);
                local_190 = bVar10._M_len;
                local_188 = bVar10._M_str;
                Jupiter::IRC::Client::sendNotice(source,sVar7,pcVar8,local_190,local_188);
                return;
              }
              bVar10 = sv("Player has been removed from the moderator list.",0x30);
              local_170 = bVar10._M_len;
              local_168 = bVar10._M_str;
              Jupiter::IRC::Client::sendNotice(source,sVar7,pcVar8,local_170,local_168);
              return;
            }
            std::__detail::
            _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false,_false>
            ::operator++(&__end7);
          }
          bVar10 = sv("Error: Player not found.",0x18);
          local_1b0 = bVar10._M_len;
          local_1a8 = bVar10._M_str;
          Jupiter::IRC::Client::sendNotice(source,sVar7,pcVar8,local_1b0,local_1a8);
        }
      }
      else if ((*(byte *)(lVar3 + 0x100) & 1) == 0) {
        _Var9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(lVar3 + 0x68));
        bVar2 = RenX_ModSystemPlugin::removeModSection(&pluginInstance,_Var9);
        if (bVar2) {
          bVar10 = sv("Player has been removed from the moderator list.",0x30);
          local_200 = bVar10._M_len;
          local_1f8 = bVar10._M_str;
          Jupiter::IRC::Client::sendNotice(source,sVar7,pcVar8,local_200,local_1f8);
        }
        else {
          bVar10 = sv("Player is not in the moderator list.",0x24);
          local_220 = bVar10._M_len;
          local_218 = bVar10._M_str;
          Jupiter::IRC::Client::sendNotice(source,sVar7,pcVar8,local_220,local_218);
        }
      }
      else {
        bVar10 = sv("Error: A bot can not be a moderator.",0x24);
        local_1d0 = bVar10._M_len;
        local_1c8 = bVar10._M_str;
        Jupiter::IRC::Client::sendNotice(source,sVar7,pcVar8,local_1d0,local_1c8);
      }
      goto LAB_0011dad5;
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

void DelIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	std::string_view parameters_view = parameters;
	if (parameters.empty())
		source->sendNotice(nick, "Error: Too few parameters. Syntax: del <player>"sv);
	else
	{
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr)
		{
			RenX::Server *server;
			RenX::PlayerInfo *player;
			int type = chan->getType();
			bool serverMatch = false;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					serverMatch = true;
					player = server->getPlayerByPartName(parameters);
					if (player == nullptr)
					{
						if (pluginInstance.removeModSection(parameters))
							source->sendNotice(nick, "Player has been removed from the moderator list."sv);
						else
						{
							for (auto& section : pluginInstance.getConfig().getSections())
							{
								if (jessilib::equalsi(section.second.get("Name"sv), parameters_view)) {
									if (pluginInstance.removeModSection(section.first))
										source->sendNotice(nick, "Player has been removed from the moderator list."sv);
									else
										source->sendNotice(nick, "Error: Unknown error occurred."sv);

									return;
								}
							}

							source->sendNotice(nick, "Error: Player not found."sv);
						}
					}
					else if (player->isBot)
						source->sendNotice(nick, "Error: A bot can not be a moderator."sv);
					else if (pluginInstance.removeModSection(player->uuid))
						source->sendNotice(nick, "Player has been removed from the moderator list."sv);
					else
						source->sendNotice(nick, "Player is not in the moderator list."sv);

					break;
				}
			}
			if (serverMatch == false)
				source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
}